

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double r8_csc(double theta)

{
  ostream *poVar1;
  double dVar2;
  double value;
  double theta_local;
  
  dVar2 = sin(theta);
  if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"R8_CSC - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Cosecant undefined for THETA = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,theta);
    std::operator<<(poVar1,"\n");
    exit(1);
  }
  return 1.0 / dVar2;
}

Assistant:

double r8_csc ( double theta )

//****************************************************************************80
//
//  Purpose:
//
//    R8_CSC returns the cosecant of X.
//
//  Discussion:
//
//    R8_CSC ( THETA ) = 1.0 / SIN ( THETA )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    05 March 2012
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double THETA, the angle, in radians, whose cosecant is desired.
//    It must be the case that SIN ( THETA ) is not zero.
//
//    Output, double R8_CSC, the cosecant of THETA.
//
{
  double value;

  value = sin ( theta );

  if ( value == 0.0 )
  {
    cerr << " \n";
    cerr << "R8_CSC - Fatal error!\n";
    cerr << "  Cosecant undefined for THETA = " << theta << "\n";
    exit ( 1 );
  }

  value = 1.0 / value;

  return value;
}